

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

ma_result ma_data_source_get_cursor_in_seconds(ma_data_source *pDataSource,float *pCursor)

{
  ma_result mVar1;
  long lVar2;
  ma_data_source_base *pDataSourceBase;
  ma_uint64 cursor;
  ma_uint32 channels;
  uint local_34;
  ulong local_30;
  undefined1 local_24 [4];
  
  if (pCursor == (float *)0x0) {
    mVar1 = MA_INVALID_ARGS;
  }
  else {
    *pCursor = 0.0;
    if (pDataSource == (ma_data_source *)0x0) {
      mVar1 = MA_INVALID_ARGS;
    }
    else if (*(code **)(*pDataSource + 0x18) == (code *)0x0) {
      mVar1 = MA_NOT_IMPLEMENTED;
    }
    else {
      mVar1 = (**(code **)(*pDataSource + 0x18))(pDataSource,&local_30);
      if (mVar1 == MA_SUCCESS) {
        lVar2 = 0;
        if (*(ulong *)((long)pDataSource + 8) <= local_30) {
          lVar2 = local_30 - *(ulong *)((long)pDataSource + 8);
        }
        if (*(code **)(*pDataSource + 0x10) == (code *)0x0) {
          mVar1 = MA_NOT_IMPLEMENTED;
        }
        else {
          mVar1 = (**(code **)(*pDataSource + 0x10))(pDataSource,&local_30,local_24,&local_34,0,0);
          if (mVar1 == MA_SUCCESS) {
            *pCursor = (float)lVar2 / (float)local_34;
            mVar1 = MA_SUCCESS;
          }
        }
      }
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_data_source_get_cursor_in_seconds(ma_data_source* pDataSource, float* pCursor)
{
    ma_result result;
    ma_uint64 cursorInPCMFrames;
    ma_uint32 sampleRate;

    if (pCursor == NULL) {
        return MA_INVALID_ARGS;
    }

    *pCursor = 0;

    result = ma_data_source_get_cursor_in_pcm_frames(pDataSource, &cursorInPCMFrames);
    if (result != MA_SUCCESS) {
        return result;
    }

    result = ma_data_source_get_data_format(pDataSource, NULL, NULL, &sampleRate, NULL, 0);
    if (result != MA_SUCCESS) {
        return result;
    }

    /* VC6 does not support division of unsigned 64-bit integers with floating point numbers. Need to use a signed number. This shouldn't effect anything in practice. */
    *pCursor = (ma_int64)cursorInPCMFrames / (float)sampleRate;

    return MA_SUCCESS;
}